

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_diag_avx2_256_32
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int32_t iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  parasail_result_t *ppVar17;
  undefined1 (*ptr) [16];
  int32_t *ptr_00;
  int32_t *ptr_01;
  long lVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [64];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  int32_t *local_2e8;
  long local_2a8;
  long local_2a0;
  long local_298;
  long local_290;
  long local_288;
  long local_280;
  long local_278;
  long local_270;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  int local_1c0;
  int iStack_1bc;
  int iStack_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  int iStack_1a8;
  int iStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  int local_160;
  int iStack_15c;
  int iStack_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  int iStack_148;
  int iStack_144;
  undefined1 local_140 [32];
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  undefined1 local_e0 [32];
  int local_c0;
  int iStack_bc;
  int iStack_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  int iStack_a8;
  int iStack_a4;
  int local_a0;
  int iStack_9c;
  int iStack_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  int iStack_88;
  int iStack_84;
  int local_80;
  int iStack_7c;
  int iStack_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int iStack_68;
  int iStack_64;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_avx2_256_32_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_table_diag_avx2_256_32_cold_6();
  }
  else if (open < 0) {
    parasail_sw_table_diag_avx2_256_32_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_table_diag_avx2_256_32_cold_4();
  }
  else {
    uVar23 = (ulong)(uint)_s1Len;
    if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_table_diag_avx2_256_32_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_table_diag_avx2_256_32_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_table_diag_avx2_256_32_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        uVar23 = (ulong)(uint)matrix->length;
      }
      iVar25 = matrix->min;
      uVar14 = 0x80000000 - iVar25;
      if (iVar25 != -open && SBORROW4(iVar25,-open) == iVar25 + open < 0) {
        uVar14 = open | 0x80000000;
      }
      iVar25 = uVar14 + 1;
      iVar12 = 0x7ffffffe - matrix->max;
      local_140._4_4_ = iVar25;
      local_140._0_4_ = iVar25;
      local_140._8_4_ = iVar25;
      local_140._12_4_ = iVar25;
      local_140._16_4_ = iVar25;
      local_140._20_4_ = iVar25;
      local_140._24_4_ = iVar25;
      local_140._28_4_ = iVar25;
      local_1e0._4_4_ = iVar25;
      local_1e0._0_4_ = iVar25;
      local_1e0._8_4_ = iVar25;
      local_1e0._12_4_ = iVar25;
      local_1e0._16_4_ = iVar25;
      local_1e0._20_4_ = iVar25;
      local_1e0._24_4_ = iVar25;
      local_1e0._28_4_ = iVar25;
      local_200._4_4_ = iVar25;
      local_200._0_4_ = iVar25;
      local_200._8_4_ = iVar25;
      local_200._12_4_ = iVar25;
      local_200._16_4_ = iVar25;
      local_200._20_4_ = iVar25;
      local_200._24_4_ = iVar25;
      local_200._28_4_ = iVar25;
      auVar42 = in_ZMM8._0_16_;
      uVar14 = (uint)uVar23;
      local_160 = iVar25;
      iStack_15c = iVar25;
      iStack_158 = iVar25;
      iStack_154 = iVar25;
      iStack_150 = iVar25;
      iStack_14c = iVar25;
      iStack_148 = iVar25;
      iStack_144 = iVar25;
      ppVar17 = parasail_result_new_table1(uVar14,s2Len);
      if (ppVar17 != (parasail_result_t *)0x0) {
        ppVar17->flag = ppVar17->flag | 0x8421004;
        uVar20 = (ulong)(s2Len + 0xe);
        ptr = (undefined1 (*) [16])parasail_memalign_int32_t(0x20,uVar20);
        ptr_00 = parasail_memalign_int32_t(0x20,uVar20);
        ptr_01 = parasail_memalign_int32_t(0x20,uVar20);
        if (ptr_01 != (int32_t *)0x0 &&
            (ptr_00 != (int32_t *)0x0 && ptr != (undefined1 (*) [16])0x0)) {
          if (matrix->type == 0) {
            iVar19 = uVar14 + 7;
            local_2e8 = parasail_memalign_int32_t(0x20,(long)iVar19);
            if (local_2e8 == (int32_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < (int)uVar14) {
              piVar3 = matrix->mapper;
              uVar20 = 0;
              do {
                local_2e8[uVar20] = piVar3[(byte)_s1[uVar20]];
                uVar20 = uVar20 + 1;
              } while (uVar23 != uVar20);
            }
            iVar16 = uVar14 + 1;
            if ((int)(uVar14 + 1) < iVar19) {
              iVar16 = iVar19;
            }
            memset(local_2e8 + (int)uVar14,0,(ulong)(~uVar14 + iVar16) * 4 + 4);
          }
          else {
            local_2e8 = (int32_t *)0x0;
          }
          uVar30 = s2Len + 7;
          auVar43._4_4_ = iStack_15c;
          auVar43._0_4_ = local_160;
          auVar43._8_4_ = iStack_158;
          auVar43._12_4_ = iStack_154;
          auVar43._16_4_ = iStack_150;
          auVar43._20_4_ = iStack_14c;
          auVar43._24_4_ = iStack_148;
          auVar43._28_4_ = iStack_144;
          local_e0 = vblendps_avx(ZEXT432(0) << 0x20,auVar43,0x7f);
          piVar3 = matrix->mapper;
          uVar24 = (ulong)(uint)s2Len;
          uVar20 = 0;
          do {
            *(int *)(ptr[1] + uVar20 * 4 + 0xc) = piVar3[(byte)_s2[uVar20]];
            uVar20 = uVar20 + 1;
          } while (uVar24 != uVar20);
          *(undefined1 (*) [16])(*ptr + 0xc) = (undefined1  [16])0x0;
          *ptr = (undefined1  [16])0x0;
          uVar13 = s2Len + 1U;
          if ((int)(s2Len + 1U) < (int)uVar30) {
            uVar13 = uVar30;
          }
          uVar20 = 0;
          auVar43 = ZEXT1632(auVar42);
          local_1c0 = iVar12;
          iStack_1bc = iVar12;
          iStack_1b8 = iVar12;
          iStack_1b4 = iVar12;
          iStack_1b0 = iVar12;
          iStack_1ac = iVar12;
          iStack_1a8 = iVar12;
          iStack_1a4 = iVar12;
          local_100 = uVar14;
          uStack_fc = uVar14;
          uStack_f8 = uVar14;
          uStack_f4 = uVar14;
          uStack_f0 = uVar14;
          uStack_ec = uVar14;
          uStack_e8 = uVar14;
          uStack_e4 = uVar14;
          local_c0 = s2Len;
          iStack_bc = s2Len;
          iStack_b8 = s2Len;
          iStack_b4 = s2Len;
          iStack_b0 = s2Len;
          iStack_ac = s2Len;
          iStack_a8 = s2Len;
          iStack_a4 = s2Len;
          local_a0 = gap;
          iStack_9c = gap;
          iStack_98 = gap;
          iStack_94 = gap;
          iStack_90 = gap;
          iStack_8c = gap;
          iStack_88 = gap;
          iStack_84 = gap;
          local_80 = open;
          iStack_7c = open;
          iStack_78 = open;
          iStack_74 = open;
          iStack_70 = open;
          iStack_6c = open;
          iStack_68 = open;
          iStack_64 = open;
          memset(ptr[1] + uVar24 * 4 + 0xc,0,(ulong)(~s2Len + uVar13) * 4 + 4);
          do {
            ptr_00[uVar20 + 7] = 0;
            ptr_01[uVar20 + 7] = iVar25;
            uVar20 = uVar20 + 1;
          } while (uVar24 != uVar20);
          lVar18 = 0;
          do {
            ptr_00[lVar18] = iVar25;
            ptr_01[lVar18] = iVar25;
            lVar18 = lVar18 + 1;
          } while (lVar18 != 7);
          lVar18 = uVar24 + 7;
          auVar39._4_4_ = iStack_15c;
          auVar39._0_4_ = local_160;
          auVar39._8_4_ = iStack_158;
          auVar39._12_4_ = iStack_154;
          auVar39._16_4_ = iStack_150;
          auVar39._20_4_ = iStack_14c;
          auVar39._24_4_ = iStack_148;
          auVar39._28_4_ = iStack_144;
          auVar41 = ZEXT3264(auVar39);
          do {
            ptr_00[lVar18] = iVar25;
            ptr_01[lVar18] = iVar25;
            lVar18 = lVar18 + 1;
            s2Len = s2Len + 1;
          } while (s2Len < (int)uVar30);
          if ((int)uVar14 < 1) {
            auVar34._4_4_ = iStack_1bc;
            auVar34._0_4_ = local_1c0;
            auVar34._8_4_ = iStack_1b8;
            auVar34._12_4_ = iStack_1b4;
            auVar34._16_4_ = iStack_1b0;
            auVar34._20_4_ = iStack_1ac;
            auVar34._24_4_ = iStack_1a8;
            auVar34._28_4_ = iStack_1a4;
            local_1e0 = auVar39;
            auVar40 = auVar39;
          }
          else {
            piVar3 = matrix->matrix;
            uVar14 = uVar14 - 1;
            uVar20 = 1;
            if (1 < (int)uVar30) {
              uVar20 = (ulong)uVar30;
            }
            auVar38 = ZEXT3264(local_140);
            auVar36 = ZEXT3264(local_200);
            local_270 = uVar24 * 0x1c + -0x1c;
            lVar18 = uVar24 * 0x20;
            local_278 = uVar24 * 4 + -4;
            local_288 = uVar24 * 0x18 + -0x18;
            local_290 = uVar24 * 0x14 + -0x14;
            local_298 = uVar24 * 8 + -8;
            local_2a0 = uVar24 * 0x10 + -0x10;
            local_2a8 = uVar24 * 0xc + -0xc;
            local_220._8_8_ = 0x400000005;
            local_220._0_8_ = 0x600000007;
            local_220._16_8_ = 0x200000003;
            local_220._24_8_ = 1;
            local_280 = 0;
            auVar43 = vpcmpeqd_avx2(auVar43,auVar43);
            auVar44 = ZEXT3264(auVar43);
            local_120 = 8;
            uStack_11c = 8;
            uStack_118 = 8;
            uStack_114 = 8;
            uStack_110 = 8;
            uStack_10c = 8;
            uStack_108 = 8;
            uStack_104 = 8;
            local_1a0._4_4_ = iStack_1bc;
            local_1a0._0_4_ = local_1c0;
            local_1a0._12_4_ = iStack_1b4;
            local_1a0._8_4_ = iStack_1b8;
            local_1a0._20_4_ = iStack_1ac;
            local_1a0._16_4_ = iStack_1b0;
            local_1a0._28_4_ = iStack_1a4;
            local_1a0._24_4_ = iStack_1a8;
            local_180 = auVar39;
            auVar45 = ZEXT3264(auVar39);
            uVar31 = 0;
            do {
              uVar22 = uVar31 | 3;
              if (matrix->type == 0) {
                uVar30 = local_2e8[uVar31];
                uVar13 = local_2e8[uVar31 + 1];
                uVar15 = local_2e8[uVar31 + 2];
                uVar27 = local_2e8[uVar22];
                uVar21 = local_2e8[uVar31 + 4];
                uVar29 = local_2e8[uVar31 + 5];
                uVar26 = local_2e8[uVar31 + 6];
                uVar28 = local_2e8[uVar31 + 7];
              }
              else {
                uVar30 = (uint)uVar31;
                uVar13 = uVar30 | 1;
                if (uVar23 <= (uVar31 | 1)) {
                  uVar13 = uVar14;
                }
                uVar15 = uVar30 | 2;
                if (uVar23 <= (uVar31 | 2)) {
                  uVar15 = uVar14;
                }
                uVar27 = uVar30 | 3;
                if (uVar23 <= uVar22) {
                  uVar27 = uVar14;
                }
                uVar21 = uVar30 | 4;
                if (uVar23 <= (uVar31 | 4)) {
                  uVar21 = uVar14;
                }
                uVar29 = uVar30 | 5;
                if (uVar23 <= (uVar31 | 5)) {
                  uVar29 = uVar14;
                }
                uVar26 = uVar30 | 6;
                if (uVar23 <= (uVar31 | 6)) {
                  uVar26 = uVar14;
                }
                uVar28 = uVar30 | 7;
                if (uVar23 <= (uVar31 | 7)) {
                  uVar28 = uVar14;
                }
              }
              iVar12 = matrix->size;
              auVar8._4_4_ = uStack_fc;
              auVar8._0_4_ = local_100;
              auVar8._8_4_ = uStack_f8;
              auVar8._12_4_ = uStack_f4;
              auVar8._16_4_ = uStack_f0;
              auVar8._20_4_ = uStack_ec;
              auVar8._24_4_ = uStack_e8;
              auVar8._28_4_ = uStack_e4;
              auVar8 = vpcmpgtd_avx2(auVar8,local_220);
              auVar10 = vpmovsxbd_avx2(ZEXT816(0xfffefdfcfbfaf9));
              auVar39 = auVar41._0_32_;
              uVar32 = 0;
              auVar43 = auVar39;
              auVar34 = local_e0;
              auVar47 = local_e0;
              do {
                auVar42 = vpinsrd_avx(ZEXT416((uint)piVar3[(long)(int)(uVar27 * iVar12) +
                                                           (long)*(int *)(ptr[1] + uVar32 * 4)]),
                                      piVar3[(long)(int)(uVar15 * iVar12) +
                                             (long)*(int *)(ptr[1] + uVar32 * 4 + 4)],1);
                auVar42 = vpinsrd_avx(auVar42,piVar3[(long)(int)(uVar13 * iVar12) +
                                                     (long)*(int *)(ptr[1] + uVar32 * 4 + 8)],2);
                auVar42 = vpinsrd_avx(auVar42,piVar3[(long)(int)(uVar30 * iVar12) +
                                                     (long)*(int *)(ptr[1] + uVar32 * 4 + 0xc)],3);
                auVar7 = vpinsrd_avx(ZEXT416((uint)piVar3[(long)(int)(uVar28 * iVar12) +
                                                          (long)*(int *)(*ptr + uVar32 * 4)]),
                                     piVar3[(long)(int)(uVar26 * iVar12) +
                                            (long)*(int *)(*ptr + uVar32 * 4 + 4)],1);
                auVar7 = vpinsrd_avx(auVar7,piVar3[(long)(int)(uVar29 * iVar12) +
                                                   (long)*(int *)(*ptr + uVar32 * 4 + 8)],2);
                auVar7 = vpinsrd_avx(auVar7,piVar3[(long)(int)(uVar21 * iVar12) +
                                                   (long)*(int *)(*ptr + uVar32 * 4 + 0xc)],3);
                auVar33._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar7;
                auVar33._16_16_ = ZEXT116(1) * auVar42;
                auVar46 = vpmovsxbd_avx2(ZEXT816(0x7060504030201));
                auVar11 = vpermd_avx2(auVar46,auVar34);
                auVar40 = vpaddd_avx2(auVar47,auVar33);
                iVar1 = ptr_00[uVar32 + 7];
                auVar47._4_4_ = iVar1;
                auVar47._0_4_ = iVar1;
                auVar47._8_4_ = iVar1;
                auVar47._12_4_ = iVar1;
                auVar47._16_4_ = iVar1;
                auVar47._20_4_ = iVar1;
                auVar47._24_4_ = iVar1;
                auVar47._28_4_ = iVar1;
                auVar47 = vpblendd_avx2(auVar11,auVar47,0x80);
                auVar43 = vpermd_avx2(auVar46,auVar43);
                iVar1 = ptr_01[uVar32 + 7];
                auVar46._4_4_ = iVar1;
                auVar46._0_4_ = iVar1;
                auVar46._8_4_ = iVar1;
                auVar46._12_4_ = iVar1;
                auVar46._16_4_ = iVar1;
                auVar46._20_4_ = iVar1;
                auVar46._24_4_ = iVar1;
                auVar46._28_4_ = iVar1;
                auVar46 = vpblendd_avx2(auVar43,auVar46,0x80);
                auVar35._4_4_ = iStack_7c;
                auVar35._0_4_ = local_80;
                auVar35._8_4_ = iStack_78;
                auVar35._12_4_ = iStack_74;
                auVar35._16_4_ = iStack_70;
                auVar35._20_4_ = iStack_6c;
                auVar35._24_4_ = iStack_68;
                auVar35._28_4_ = iStack_64;
                auVar43 = vpsubd_avx2(auVar47,auVar35);
                auVar11._4_4_ = iStack_9c;
                auVar11._0_4_ = local_a0;
                auVar11._8_4_ = iStack_98;
                auVar11._12_4_ = iStack_94;
                auVar11._16_4_ = iStack_90;
                auVar11._20_4_ = iStack_8c;
                auVar11._24_4_ = iStack_88;
                auVar11._28_4_ = iStack_84;
                auVar46 = vpsubd_avx2(auVar46,auVar11);
                auVar43 = vpmaxsd_avx2(auVar43,auVar46);
                auVar34 = vpsubd_avx2(auVar34,auVar35);
                auVar39 = vpsubd_avx2(auVar39,auVar11);
                auVar46 = vpmaxsd_avx2(auVar34,auVar39);
                auVar39 = vpmaxsd_avx2(auVar46,auVar43);
                auVar39 = vpmaxsd_avx2(auVar39,_DAT_00908c40);
                auVar40 = vpmaxsd_avx2(auVar40,auVar39);
                auVar39 = vpcmpeqd_avx2(auVar10,auVar44._0_32_);
                auVar34 = vpandn_avx2(auVar39,auVar40);
                if (7 < uVar32) {
                  local_1a0 = vpminsd_avx2(local_1a0,auVar34);
                  local_180 = vpmaxsd_avx2(local_180,auVar34);
                }
                piVar4 = ((ppVar17->field_4).rowcols)->score_row;
                if (uVar32 < uVar24) {
                  *(int *)((long)piVar4 + uVar32 * 4 + local_280) = auVar34._28_4_;
                }
                if (uVar32 - 1 < uVar24 && (uVar31 | 1) < uVar23) {
                  *(int *)((long)piVar4 + uVar32 * 4 + local_278) = auVar34._24_4_;
                }
                if (((uVar31 | 2) < uVar23) && ((long)(uVar32 - 2) < (long)uVar24 && 1 < uVar32)) {
                  *(int *)((long)piVar4 + uVar32 * 4 + local_298) = auVar34._20_4_;
                }
                if ((uVar22 < uVar23) && ((long)(uVar32 - 3) < (long)uVar24 && 2 < uVar32)) {
                  *(int *)((long)piVar4 + uVar32 * 4 + local_2a8) = auVar34._16_4_;
                }
                if (((uVar31 | 4) < uVar23) && ((long)(uVar32 - 4) < (long)uVar24 && 3 < uVar32)) {
                  *(int *)((long)piVar4 + uVar32 * 4 + local_2a0) = auVar34._12_4_;
                }
                if (((uVar31 | 5) < uVar23) && ((long)(uVar32 - 5) < (long)uVar24 && 4 < uVar32)) {
                  *(int *)((long)piVar4 + uVar32 * 4 + local_290) = auVar34._8_4_;
                }
                if (((uVar31 | 6) < uVar23) && ((long)(uVar32 - 6) < (long)uVar24 && 5 < uVar32)) {
                  *(int *)((long)piVar4 + uVar32 * 4 + local_288) = auVar34._4_4_;
                }
                auVar43 = vblendvps_avx(auVar43,auVar41._0_32_,auVar39);
                if (6 < uVar32 && (uVar31 | 7) < uVar23) {
                  *(int32_t *)((long)piVar4 + uVar32 * 4 + local_270) = auVar34._0_4_;
                }
                auVar9._4_4_ = iStack_bc;
                auVar9._0_4_ = local_c0;
                auVar9._8_4_ = iStack_b8;
                auVar9._12_4_ = iStack_b4;
                auVar9._16_4_ = iStack_b0;
                auVar9._20_4_ = iStack_ac;
                auVar9._24_4_ = iStack_a8;
                auVar9._28_4_ = iStack_a4;
                auVar11 = vpcmpgtd_avx2(auVar9,auVar10);
                auVar11 = vpand_avx2(auVar8,auVar11);
                auVar35 = vpsrad_avx2(auVar10,0x1f);
                auVar35 = vpandn_avx2(auVar35,auVar11);
                auVar42 = vpackssdw_avx(auVar35._0_16_,auVar35._16_16_);
                auVar37 = auVar38._0_32_;
                auVar33 = vpcmpeqd_avx2(auVar34,auVar37);
                auVar9 = vpcmpgtd_avx2(auVar34,auVar37);
                auVar11 = vpand_avx2(auVar9,auVar35);
                local_140 = vblendvps_avx(auVar37,auVar40,auVar11);
                auVar38 = ZEXT3264(local_140);
                auVar7 = vpackssdw_avx(auVar11._0_16_,auVar11._16_16_);
                auVar40 = vpcmpgtd_avx2(auVar36._0_32_,auVar10);
                auVar11 = vpand_avx2(auVar40,auVar33);
                auVar6 = vpackssdw_avx(auVar11._0_16_,auVar11._16_16_);
                auVar42 = vpblendvb_avx(auVar7,auVar42,auVar6);
                auVar40._4_4_ = iStack_15c;
                auVar40._0_4_ = local_160;
                auVar40._8_4_ = iStack_158;
                auVar40._12_4_ = iStack_154;
                auVar40._16_4_ = iStack_150;
                auVar40._20_4_ = iStack_14c;
                auVar40._24_4_ = iStack_148;
                auVar40._28_4_ = iStack_144;
                auVar41 = ZEXT3264(auVar40);
                auVar39 = vblendvps_avx(auVar46,auVar40,auVar39);
                auVar46 = vpmovsxwd_avx2(auVar42);
                local_1e0 = vblendvps_avx(auVar45._0_32_,local_220,auVar46);
                auVar45 = ZEXT3264(local_1e0);
                auVar46 = vpor_avx2(auVar9,auVar11);
                auVar46 = vpand_avx2(auVar35,auVar46);
                local_200 = vblendvps_avx(auVar36._0_32_,auVar10,auVar46);
                auVar36 = ZEXT3264(local_200);
                ptr_00[uVar32] = auVar34._0_4_;
                ptr_01[uVar32] = auVar43._0_4_;
                auVar46 = vpcmpeqd_avx2(auVar9,auVar9);
                auVar44 = ZEXT3264(auVar46);
                auVar10 = vpsubd_avx2(auVar10,auVar46);
                uVar32 = uVar32 + 1;
              } while (uVar20 != uVar32);
              auVar10._8_4_ = 8;
              auVar10._0_8_ = 0x800000008;
              auVar10._12_4_ = 8;
              auVar10._16_4_ = 8;
              auVar10._20_4_ = 8;
              auVar10._24_4_ = 8;
              auVar10._28_4_ = 8;
              local_220 = vpaddd_avx2(local_220,auVar10);
              uVar31 = uVar31 + 8;
              local_270 = local_270 + lVar18;
              local_280 = local_280 + lVar18;
              local_278 = local_278 + lVar18;
              local_288 = local_288 + lVar18;
              local_290 = local_290 + lVar18;
              local_2a0 = local_2a0 + lVar18;
              local_2a8 = local_2a8 + lVar18;
              local_298 = local_298 + lVar18;
            } while (uVar31 < uVar23);
            auVar34 = local_1a0;
            auVar39 = local_180;
          }
          lVar18 = 0;
          iVar16 = 0;
          iVar12 = 0;
          iVar19 = 0;
          do {
            iVar2 = *(int *)(local_140 + lVar18 * 4);
            if (iVar25 < iVar2) {
              iVar25 = iVar2;
              iVar12 = *(int *)(local_1e0 + lVar18 * 4);
              iVar19 = *(int *)(local_200 + lVar18 * 4);
              iVar16 = *(int *)(local_1e0 + lVar18 * 4);
            }
            else if (iVar2 == iVar25) {
              iVar2 = *(int *)(local_200 + lVar18 * 4);
              if (iVar2 < iVar19) {
                iVar12 = *(int *)(local_1e0 + lVar18 * 4);
                iVar19 = iVar2;
                iVar16 = *(int *)(local_1e0 + lVar18 * 4);
              }
              else if ((iVar2 == iVar19) &&
                      (iVar2 = *(int *)(local_1e0 + lVar18 * 4), bVar5 = iVar2 < iVar12,
                      iVar12 = iVar16, bVar5)) {
                iVar12 = iVar2;
                iVar16 = iVar2;
              }
            }
            lVar18 = lVar18 + 1;
          } while ((int)lVar18 != 8);
          auVar43 = vpcmpgtd_avx2(auVar40,auVar34);
          auVar37._4_4_ = iStack_1bc;
          auVar37._0_4_ = local_1c0;
          auVar37._8_4_ = iStack_1b8;
          auVar37._12_4_ = iStack_1b4;
          auVar37._16_4_ = iStack_1b0;
          auVar37._20_4_ = iStack_1ac;
          auVar37._24_4_ = iStack_1a8;
          auVar37._28_4_ = iStack_1a4;
          auVar39 = vpcmpgtd_avx2(auVar39,auVar37);
          auVar43 = vpor_avx2(auVar43,auVar39);
          if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar43 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar43 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar43 >> 0x7f,0) != '\0') ||
                (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar43 >> 0xbf,0) != '\0') ||
              (auVar43 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar43[0x1f] < '\0') {
            *(byte *)&ppVar17->flag = (byte)ppVar17->flag | 0x40;
            iVar25 = 0;
            iVar19 = 0;
            iVar12 = 0;
          }
          ppVar17->score = iVar25;
          ppVar17->end_query = iVar12;
          ppVar17->end_ref = iVar19;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_2e8);
            return ppVar17;
          }
          return ppVar17;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int32_t * restrict s1 = NULL;
    int32_t * restrict s2B = NULL;
    int32_t * restrict _H_pr = NULL;
    int32_t * restrict _F_pr = NULL;
    int32_t * restrict s2 = NULL;
    int32_t * restrict H_pr = NULL;
    int32_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 8; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi32(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 4); /* shift in a 0 */
    vOpen = _mm256_set1_epi32(open);
    vGap  = _mm256_set1_epi32(gap);
    vZero = _mm256_set1_epi32(0);
    vOne = _mm256_set1_epi32(1);
    vN = _mm256_set1_epi32(N);
    vNegOne = _mm256_set1_epi32(-1);
    vI = _mm256_set_epi32(0,1,2,3,4,5,6,7);
    vJreset = _mm256_set_epi32(0,-1,-2,-3,-4,-5,-6,-7);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi32(s1Len);
    vJLimit = _mm256_set1_epi32(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int32_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int32_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int32_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        __m256i vIltLimit = _mm256_cmplt_epi32_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 4);
            vNH = _mm256_insert_epi32_rpl(vNH, H_pr[j], 7);
            vF = _mm256_srli_si256_rpl(vF, 4);
            vF = _mm256_insert_epi32_rpl(vF, F_pr[j], 7);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vNH, vOpen),
                    _mm256_sub_epi32(vF, vGap));
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vWH, vOpen),
                    _mm256_sub_epi32(vE, vGap));
            vMat = _mm256_set_epi32(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]]
                    );
            vNWH = _mm256_add_epi32(vNWH, vMat);
            vWH = _mm256_max_epi32(vNWH, vE);
            vWH = _mm256_max_epi32(vWH, vF);
            vWH = _mm256_max_epi32(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi32(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vWH,0);
            F_pr[j-7] = (int32_t)_mm256_extract_epi32_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi32(vJ, vNegOne),
                        _mm256_cmplt_epi32_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi32(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi32(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi32_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi32(vJ, vOne);
        }
        vI = _mm256_add_epi32(vI, vN);
    }

    /* alignment ending position */
    {
        int32_t *t = (int32_t*)&vMaxH;
        int32_t *i = (int32_t*)&vEndI;
        int32_t *j = (int32_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}